

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::StochasticTask::checkArguments
          (StochasticTask *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4
          )

{
  ulong min;
  Compilation *pCVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  Type *pTVar6;
  long lVar7;
  ulong uVar8;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  sVar2 = this->inputArgs;
  sVar3 = this->outputArgs;
  min = sVar2 + sVar3;
  bVar4 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,min,min);
  pTVar6 = (Type *)CONCAT71(extraout_var,bVar4);
  lVar7 = 400;
  if (bVar4) {
    bVar4 = min != 0;
    if (bVar4) {
      bVar5 = Type::isIntegral(((*args->_M_ptr)->type).ptr);
      pTVar6 = (Type *)CONCAT71(extraout_var_00,bVar5);
      if (bVar5) {
        uVar8 = 0;
        do {
          if ((sVar3 + sVar2) - 1 == uVar8) {
            bVar4 = false;
            goto LAB_0041ca92;
          }
          bVar4 = Type::isIntegral((args->_M_ptr[uVar8 + 1]->type).ptr);
          pTVar6 = (Type *)CONCAT71(extraout_var_01,bVar4);
          uVar8 = uVar8 + 1;
        } while (bVar4);
        bVar4 = uVar8 < min;
      }
      else {
        uVar8 = 0;
      }
      pTVar6 = SystemSubroutine::badArg(&this->super_SystemSubroutine,context,args->_M_ptr[uVar8]);
    }
LAB_0041ca92:
    if (bVar4) {
      return pTVar6;
    }
    lVar7 = 0x188;
    if ((this->super_SystemSubroutine).kind == Function) {
      lVar7 = 0x158;
    }
  }
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar7);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        size_t totalArgs = inputArgs + outputArgs;
        if (!checkArgCount(context, false, args, range, totalArgs, totalArgs))
            return comp.getErrorType();

        for (size_t i = 0; i < totalArgs; i++) {
            if (!args[i]->type->isIntegral())
                return badArg(context, *args[i]);
        }

        return kind == SubroutineKind::Function ? comp.getIntType() : comp.getVoidType();
    }